

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O1

void json_throw_parse_error(lua_State *l,json_parse_t *json,char *exp,json_token_t *token)

{
  anon_union_8_3_08600ed0_for_value *paVar1;
  
  strbuf_free(json->tmp);
  paVar1 = (anon_union_8_3_08600ed0_for_value *)(json_token_type_name + token->type);
  if ((ulong)token->type == 0xc) {
    paVar1 = &token->value;
  }
  luaL_error(l,"Expected %s but found %s at character %d",exp,paVar1->string,
             (ulong)(token->index + 1));
  return;
}

Assistant:

static void json_throw_parse_error(lua_State *l, json_parse_t *json,
                                   const char *exp, json_token_t *token)
{
    const char *found;

    strbuf_free(json->tmp);

    if (token->type == T_ERROR)
        found = token->value.string;
    else
        found = json_token_type_name[token->type];

    /* Note: token->index is 0 based, display starting from 1 */
    luaL_error(l, "Expected %s but found %s at character %d",
               exp, found, token->index + 1);
}